

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::internal::add_thousands_sep<wchar_t>::operator()
          (add_thousands_sep<wchar_t> *this,wchar_t **buffer)

{
  size_t sVar1;
  wchar_t *pwVar2;
  uint uVar3;
  
  uVar3 = this->digit_index_ + 1;
  this->digit_index_ = uVar3;
  if (uVar3 % 3 == 0) {
    sVar1 = (this->sep_).size_;
    pwVar2 = *buffer;
    *buffer = pwVar2 + -sVar1;
    if (sVar1 != 0) {
      memmove(pwVar2 + -sVar1,(this->sep_).data_,sVar1 * 4);
      return;
    }
  }
  return;
}

Assistant:

void operator()(Char *&buffer) {
    if (++digit_index_ % 3 != 0)
      return;
    buffer -= sep_.size();
    std::uninitialized_copy(sep_.data(), sep_.data() + sep_.size(),
                            internal::make_checked(buffer, sep_.size()));
  }